

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cshutdn.c
# Opt level: O2

CURLMcode cshutdn_update_ev(cshutdn *cshutdn,Curl_easy *data,connectdata *conn)

{
  CURLMcode CVar1;
  
  Curl_attach_connection(data,conn);
  CVar1 = Curl_multi_ev_assess_conn(cshutdn->multi,data,conn);
  Curl_detach_connection(data);
  return CVar1;
}

Assistant:

static CURLMcode cshutdn_update_ev(struct cshutdn *cshutdn,
                                     struct Curl_easy *data,
                                     struct connectdata *conn)
{
  CURLMcode mresult;

  DEBUGASSERT(cshutdn);
  DEBUGASSERT(cshutdn->multi->socket_cb);

  Curl_attach_connection(data, conn);
  mresult = Curl_multi_ev_assess_conn(cshutdn->multi, data, conn);
  Curl_detach_connection(data);
  return mresult;
}